

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O1

char * __thiscall
adios2::format::BP5Deserializer::BreakdownVarName
          (BP5Deserializer *this,char *Name,DataType *type_p,int *element_size_p)

{
  long lVar1;
  char *local_20;
  
  lVar1 = strtol(Name + 4,&local_20,10);
  *element_size_p = (int)lVar1;
  local_20 = local_20 + 1;
  lVar1 = strtol(local_20,&local_20,10);
  *type_p = (DataType)lVar1;
  local_20 = local_20 + 1;
  if ((DataType)lVar1 == Struct) {
    local_20 = strchr(local_20,0x5f);
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

const char *BP5Deserializer::BreakdownVarName(const char *Name, DataType *type_p,
                                              int *element_size_p)
{
    // const char *NameStart = strchr(strchr(Name + 4, '_') + 1, '_') + 1;
    // sscanf(Name + 4, "%d_%d", &ElementSize, &Type);
    /* string formatted as bp5_%d_%d_actualname */
    char *p;
    // + 3 to skip BP5_ or bp5_ prefix
    long n = strtol(Name + 4, &p, 10);
    *element_size_p = static_cast<int>(n);
    ++p; // skip '_'
    long Type = strtol(p, &p, 10);
    *type_p = (DataType)Type;
    ++p; // skip '_'
    if (*type_p == DataType::Struct)
    {
        p = strchr(p, '_');
        ++p;
    }
    return p;
}